

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_map_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uint32_t count,
                    uint32_t size,AMQP_MAP_KEY_VALUE_PAIR *pairs,_Bool use_smallest)

{
  int iVar1;
  int iVar2;
  int iVar3;
  LOGGER_LOG p_Var4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  ulong uStack_38;
  uint32_t elements;
  size_t i;
  int result;
  _Bool use_smallest_local;
  AMQP_MAP_KEY_VALUE_PAIR *pairs_local;
  uint32_t size_local;
  uint32_t count_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  iVar1 = count << 1;
  if (use_smallest) {
    iVar2 = output_byte(encoder_output,context,(char)size + '\x01');
    if ((iVar2 == 0) && (iVar1 = output_byte(encoder_output,context,(uchar)iVar1), iVar1 == 0)) {
      i._0_4_ = 0;
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"encode_map_value",0xfc9,1,"Could not encode small map header");
      }
      i._0_4_ = 0xfca;
    }
  }
  else {
    iVar2 = size + 4;
    iVar3 = output_byte(encoder_output,context,(uchar)((uint)iVar2 >> 0x18));
    if (((((iVar3 == 0) &&
          (iVar3 = output_byte(encoder_output,context,(uchar)((uint)iVar2 >> 0x10)), iVar3 == 0)) &&
         (iVar3 = output_byte(encoder_output,context,(uchar)((uint)iVar2 >> 8)), iVar3 == 0)) &&
        ((iVar2 = output_byte(encoder_output,context,(uchar)iVar2), iVar2 == 0 &&
         (iVar2 = output_byte(encoder_output,context,(uchar)((uint)iVar1 >> 0x18)), iVar2 == 0))))
       && ((iVar2 = output_byte(encoder_output,context,(uchar)((uint)iVar1 >> 0x10)), iVar2 == 0 &&
           ((iVar2 = output_byte(encoder_output,context,(uchar)((uint)iVar1 >> 8)), iVar2 == 0 &&
            (iVar1 = output_byte(encoder_output,context,(uchar)iVar1), iVar1 == 0)))))) {
      i._0_4_ = 0;
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"encode_map_value",0xfe1,1,"Could not encode large map header");
      }
      i._0_4_ = 0xfe2;
    }
  }
  if ((int)i == 0) {
    for (uStack_38 = 0; uStack_38 < count; uStack_38 = uStack_38 + 1) {
      iVar1 = amqpvalue_encode(pairs[uStack_38].key,encoder_output,context);
      if ((iVar1 != 0) ||
         (iVar1 = amqpvalue_encode(pairs[uStack_38].value,encoder_output,context), iVar1 != 0)) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"encode_map_value",0xff3,1,"Failed encoding map element %u",(int)uStack_38);
        }
        break;
      }
    }
    if (uStack_38 < count) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"encode_map_value",0xffa,1,"Could not encode map");
      }
      i._0_4_ = 0xffb;
    }
    else {
      i._0_4_ = 0;
    }
  }
  return (int)i;
}

Assistant:

static int encode_map_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, uint32_t count, uint32_t size, AMQP_MAP_KEY_VALUE_PAIR* pairs, bool use_smallest)
{
    int result;
    size_t i;

    /* Codes_SRS_AMQPVALUE_01_124: [Map encodings MUST contain an even number of items (i.e. an equal number of keys and values).] */
    uint32_t elements = count * 2;

    if (use_smallest)
    {
        size++;

        /* Codes_SRS_AMQPVALUE_01_306: [<encoding name="map8" code="0xc1" category="compound" width="1" label="up to 2^8 - 1 octets of encoded map data"/>] */
        if ((output_byte(encoder_output, context, (size & 0xFF)) != 0) ||
            (output_byte(encoder_output, context, (elements & 0xFF)) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Could not encode small map header");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        size += 4;

        /* Codes_SRS_AMQPVALUE_01_307: [<encoding name="map32" code="0xd1" category="compound" width="4" label="up to 2^32 - 1 octets of encoded map data"/>] */
        if ((output_byte(encoder_output, context, (size >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (size >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (size >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, size & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (elements >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (elements >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (elements >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, elements & 0xFF) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Could not encode large map header");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    if (result == 0)
    {
        /* Codes_SRS_AMQPVALUE_01_123: [A map is encoded as a compound value where the constituent elements form alternating key value pairs.] */
        for (i = 0; i < count; i++)
        {
            if ((amqpvalue_encode(pairs[i].key, encoder_output, context) != 0) ||
                (amqpvalue_encode(pairs[i].value, encoder_output, context) != 0))
            {
                LogError("Failed encoding map element %u", (unsigned int)i);
                break;
            }
        }

        if (i < count)
        {
            LogError("Could not encode map");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    return result;
}